

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

size_t __thiscall duckdb_re2::DFA::StateHash::operator()(StateHash *this,State *a)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (ulong)a->flag_ + 0x53;
  uVar3 = 0;
  uVar1 = (ulong)(uint)a->ninst_;
  if (a->ninst_ < 1) {
    uVar1 = uVar3;
  }
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    lVar2 = ((ulong)(lVar2 * -0x23c146b50754b36d) >> 0x2d | lVar2 * -0x35a83aa59b680000) +
            (long)a->inst_[uVar3];
  }
  return (ulong)(lVar2 * -0x23c146b50754b36d) >> 0x2d | lVar2 * -0x35a83aa59b680000;
}

Assistant:

size_t operator()(const State* a) const {
      DCHECK(a != NULL);
      HashMix mix(a->flag_);
      for (int i = 0; i < a->ninst_; i++)
        mix.Mix(a->inst_[i]);
      mix.Mix(0);
      return mix.get();
    }